

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void TestCalloc(size_t n,size_t s,bool ok)

{
  _func_void_ptr_unsigned_long_unsigned_long *p_Var1;
  void *__ptr;
  int local_2c;
  int i;
  char *p;
  bool ok_local;
  size_t s_local;
  size_t n_local;
  
  p_Var1 = __noopt<void*(*)(unsigned_long,unsigned_long)noexcept>_void_____unsigned_long_unsigned_long_noexcept__
                     (calloc);
  __ptr = (*p_Var1)(n,s);
  if (ok) {
    if (__ptr == (void *)0x0) {
      syscall(1,2,"Check failed: p != nullptr\n",0x1b);
      abort();
    }
    for (local_2c = 0; (ulong)(long)local_2c < n * s; local_2c = local_2c + 1) {
      if (*(char *)((long)__ptr + (long)local_2c) != '\0') {
        syscall(1,2,"Check failed: p[i] == \'\\0\'\n",0x1b);
        abort();
      }
    }
    free(__ptr);
  }
  else if (__ptr != (void *)0x0) {
    syscall(1,2,"Check failed: p == nullptr\n",0x1b);
    abort();
  }
  return;
}

Assistant:

static void TestCalloc(size_t n, size_t s, bool ok) {
  char* p = reinterpret_cast<char*>(noopt(calloc)(n, s));
  if (!ok) {
    CHECK(p == nullptr);  // calloc(n, s) should not succeed
  } else {
    CHECK(p != nullptr);  // calloc(n, s) should succeed
    for (int i = 0; i < n*s; i++) {
      CHECK(p[i] == '\0');
    }
    free(p);
  }
}